

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_nls.c
# Opt level: O0

int IDAGetNonlinearSystemData
              (void *ida_mem,sunrealtype *tcur,N_Vector *yypred,N_Vector *yppred,N_Vector *yyn,
              N_Vector *ypn,N_Vector *res,sunrealtype *cj,void **user_data)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0xa9,"IDAGetNonlinearSystemData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_nls.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    *in_RSI = *(undefined8 *)(in_RDI + 0x2a8);
    *in_RDX = *(undefined8 *)(in_RDI + 0x198);
    *in_RCX = *(undefined8 *)(in_RDI + 0x1a0);
    *in_R8 = *(undefined8 *)(in_RDI + 0x188);
    *in_R9 = *(undefined8 *)(in_RDI + 400);
    IDA_mem->ida_sunctx = *(SUNContext_conflict *)(in_RDI + 0x1c0);
    *ypn = *(N_Vector *)(in_RDI + 0x2b8);
    *yyn = *(N_Vector *)(in_RDI + 0x18);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDAGetNonlinearSystemData(void* ida_mem, sunrealtype* tcur, N_Vector* yypred,
                              N_Vector* yppred, N_Vector* yyn, N_Vector* ypn,
                              N_Vector* res, sunrealtype* cj, void** user_data)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  *tcur      = IDA_mem->ida_tn;
  *yypred    = IDA_mem->ida_yypredict;
  *yppred    = IDA_mem->ida_yppredict;
  *yyn       = IDA_mem->ida_yy;
  *ypn       = IDA_mem->ida_yp;
  *res       = IDA_mem->ida_savres;
  *cj        = IDA_mem->ida_cj;
  *user_data = IDA_mem->ida_user_data;

  return (IDA_SUCCESS);
}